

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O2

void M_SetMenu(FName *menu,int param)

{
  FMenuDescriptor *pFVar1;
  bool bVar2;
  char *message;
  FMenuDescriptor **ppFVar3;
  PClass *pPVar4;
  ClassReg *pCVar5;
  DMenu *menu_00;
  FName *action;
  FOptionMenuDescriptor *ld;
  int iVar6;
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  FName local_20;
  FName local_1c;
  _func_int **local_18;
  
  switch(menu->Index) {
  case 0x1d6:
    GameStartupInfo.Episode = -1;
    GameStartupInfo.Skill = -1;
    if (param == -1000) {
      GameStartupInfo.PlayerClass = (char *)0x0;
    }
    else if (param == -1) {
      GameStartupInfo.PlayerClass = "Random";
    }
    else {
      GetPrintableDisplayName((PClassPlayerPawn *)&stack0xffffffffffffffe8);
      GameStartupInfo.PlayerClass = (char *)local_18;
      FString::~FString((FString *)&stack0xffffffffffffffe8);
    }
    break;
  case 0x1d9:
    if ((0 < param) && ((gameinfo.flags & 2U) != 0)) {
      message = FStringTable::operator()(&GStrings,"SWSTRING");
      action = &local_1c;
LAB_00355435:
      action->Index = 0;
      iVar6 = 1;
      goto LAB_00355663;
    }
    GameStartupInfo.Episode = param;
    M_StartupSkillMenu(&GameStartupInfo);
    break;
  case 0x1da:
    GameStartupInfo.Skill = param;
  case 0x1dc:
    G_DeferedInitNew(&GameStartupInfo);
    if (gamestate == GS_FULLCONSOLE) {
      gamestate = GS_HIDECONSOLE;
      gameaction = ga_newgame;
    }
    M_ClearMenus();
    return;
  case 0x1db:
    GameStartupInfo.Skill = param;
    message = AllSkills.Array[param].MustConfirmText.Chars;
    if (*message == '\0') {
      message = FStringTable::operator()(&GStrings,"NIGHTMARE");
    }
    action = &local_20;
    local_20.Index = 0x1dc;
    iVar6 = 0;
    goto LAB_00355663;
  case 0x1de:
    if ((!usergame) ||
       ((((int)(&DAT_009ba4b8)[(long)consoleplayer * 0xa8] < 1 && (!multiplayer)) ||
        (gamestate != GS_LEVEL)))) {
      message = FStringTable::operator()(&GStrings,"SAVEDEAD");
      action = &local_24;
      goto LAB_00355435;
    }
  }
  local_28 = (FName)menu->Index;
  ppFVar3 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
            CheckKey(&MenuDescriptors,&local_28);
  if (ppFVar3 == (FMenuDescriptor **)0x0) {
    local_30 = (FName)menu->Index;
    pPVar4 = PClass::FindClass(&local_30);
    if ((pPVar4 == (PClass *)0x0) ||
       (bVar2 = PClass::IsAncestorOf(DMenu::RegistrationInfo.MyClass,pPVar4), !bVar2)) {
      Printf("Attempting to open menu of unknown type \'%s\'\n",
             FName::NameData.NameArray[menu->Index].Text);
      M_ClearMenus();
      return;
    }
    menu_00 = (DMenu *)PClass::CreateNew(pPVar4);
    (menu_00->mParentMenu).field_0.p = DMenu::CurrentMenu;
    goto LAB_00355651;
  }
  pFVar1 = *ppFVar3;
  message = (pFVar1->mNetgameMessage).Chars;
  if (((*(int *)(message + -0xc) != 0) && (netgame == true)) && (demoplayback == false)) {
    action = &local_2c;
    local_2c.Index = 0;
    iVar6 = 1;
LAB_00355663:
    M_StartMessage(message,iVar6,action);
    return;
  }
  if (pFVar1->mType == 1) {
    pPVar4 = pFVar1->mClass;
    if (pPVar4 == (PClass *)0x0) {
      pCVar5 = &DOptionMenu::RegistrationInfo;
      goto LAB_00355630;
    }
  }
  else {
    if (pFVar1->mType != 0) {
      return;
    }
    iVar6 = *(int *)&pFVar1[2].mNetgameMessage.Chars;
    if ((-1 < (long)iVar6) && (iVar6 < *(int *)&pFVar1[1].field_0xc)) {
      (**(code **)(*(long *)pFVar1[1]._vptr_FMenuDescriptor[iVar6] + 0x30))();
      return;
    }
    pPVar4 = pFVar1->mClass;
    if (pPVar4 == (PClass *)0x0) {
      pCVar5 = &DListMenu::RegistrationInfo;
LAB_00355630:
      pPVar4 = pCVar5->MyClass;
    }
  }
  menu_00 = (DMenu *)PClass::CreateNew(pPVar4);
  (*(menu_00->super_DObject)._vptr_DObject[0xf])(menu_00,DMenu::CurrentMenu,pFVar1);
LAB_00355651:
  M_ActivateMenu(menu_00);
  return;
}

Assistant:

void M_SetMenu(FName menu, int param)
{
	// some menus need some special treatment
	switch (menu)
	{
	case NAME_Episodemenu:
		// sent from the player class menu
		GameStartupInfo.Skill = -1;
		GameStartupInfo.Episode = -1;
		GameStartupInfo.PlayerClass = 
			param == -1000? NULL :
			param == -1? "Random" : GetPrintableDisplayName(PlayerClasses[param].Type).GetChars();
		break;

	case NAME_Skillmenu:
		// sent from the episode menu

		if ((gameinfo.flags & GI_SHAREWARE) && param > 0)
		{
			// Only Doom and Heretic have multi-episode shareware versions.
			M_StartMessage(GStrings("SWSTRING"), 1);
			return;
		}

		GameStartupInfo.Episode = param;
		M_StartupSkillMenu(&GameStartupInfo);	// needs player class name from class menu (later)
		break;

	case NAME_StartgameConfirm:
	{
		// sent from the skill menu for a skill that needs to be confirmed
		GameStartupInfo.Skill = param;

		const char *msg = AllSkills[param].MustConfirmText;
		if (*msg==0) msg = GStrings("NIGHTMARE");
		M_StartMessage (msg, 0, NAME_StartgameConfirmed);
		return;
	}

	case NAME_Startgame:
		// sent either from skill menu or confirmation screen. Skill gets only set if sent from skill menu
		// Now we can finally start the game. Ugh...
		GameStartupInfo.Skill = param;
	case NAME_StartgameConfirmed:

		G_DeferedInitNew (&GameStartupInfo);
		if (gamestate == GS_FULLCONSOLE)
		{
			gamestate = GS_HIDECONSOLE;
			gameaction = ga_newgame;
		}
		M_ClearMenus ();
		return;

	case NAME_Savegamemenu:
		if (!usergame || (players[consoleplayer].health <= 0 && !multiplayer) || gamestate != GS_LEVEL)
		{
			// cannot save outside the game.
			M_StartMessage (GStrings("SAVEDEAD"), 1);
			return;
		}
	}

	// End of special checks

	FMenuDescriptor **desc = MenuDescriptors.CheckKey(menu);
	if (desc != NULL)
	{
		if ((*desc)->mNetgameMessage.IsNotEmpty() && netgame && !demoplayback)
		{
			M_StartMessage((*desc)->mNetgameMessage, 1);
			return;
		}

		if ((*desc)->mType == MDESC_ListMenu)
		{
			FListMenuDescriptor *ld = static_cast<FListMenuDescriptor*>(*desc);
			if (ld->mAutoselect >= 0 && ld->mAutoselect < (int)ld->mItems.Size())
			{
				// recursively activate the autoselected item without ever creating this menu.
				ld->mItems[ld->mAutoselect]->Activate();
			}
			else
			{
				const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DListMenu) : ld->mClass;

				DListMenu *newmenu = (DListMenu *)cls->CreateNew();
				newmenu->Init(DMenu::CurrentMenu, ld);
				M_ActivateMenu(newmenu);
			}
		}
		else if ((*desc)->mType == MDESC_OptionsMenu)
		{
			FOptionMenuDescriptor *ld = static_cast<FOptionMenuDescriptor*>(*desc);
			const PClass *cls = ld->mClass == NULL? RUNTIME_CLASS(DOptionMenu) : ld->mClass;

			DOptionMenu *newmenu = (DOptionMenu *)cls->CreateNew();
			newmenu->Init(DMenu::CurrentMenu, ld);
			M_ActivateMenu(newmenu);
		}
		return;
	}
	else
	{
		const PClass *menuclass = PClass::FindClass(menu);
		if (menuclass != NULL)
		{
			if (menuclass->IsDescendantOf(RUNTIME_CLASS(DMenu)))
			{
				DMenu *newmenu = (DMenu*)menuclass->CreateNew();
				newmenu->mParentMenu = DMenu::CurrentMenu;
				M_ActivateMenu(newmenu);
				return;
			}
		}
	}
	Printf("Attempting to open menu of unknown type '%s'\n", menu.GetChars());
	M_ClearMenus();
}